

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise3d.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise3D::forward
          (ConvolutionDepthWise3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  size_t _elemsize;
  float *pfVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int *piVar7;
  ConvolutionDepthWise3D *pCVar8;
  Mat *pMVar9;
  int iVar10;
  int iVar11;
  pointer piVar12;
  uint uVar13;
  uint _h;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  void *pvVar20;
  void *pvVar21;
  uint _w;
  size_type __n;
  int iVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  int iVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int outd;
  int outh;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_pad;
  void *local_1e0;
  allocator_type local_1d1;
  ulong local_1d0;
  float *local_1c8;
  void *local_1c0;
  Option *local_1b8;
  long local_1b0;
  void *local_1a8;
  void *local_1a0;
  ConvolutionDepthWise3D *local_198;
  void *local_190;
  float *local_188;
  Mat *local_180;
  ulong local_178;
  long local_170;
  ulong local_168;
  ulong local_160;
  long local_158;
  long local_150;
  void *local_148;
  long local_140;
  void *local_138;
  long local_130;
  ulong local_128;
  int local_120;
  uint local_11c;
  Mat local_118;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  long local_a8;
  void *local_a0;
  long local_98;
  vector<int,_std::allocator<int>_> local_90;
  Option local_78;
  
  iVar16 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  iVar30 = this->kernel_w;
  iVar15 = this->kernel_h;
  iVar14 = this->dilation_w;
  iVar2 = this->dilation_h;
  iVar19 = this->kernel_d;
  iVar22 = this->dilation_d;
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize._0_4_ = 0;
  local_118.elemsize._4_4_ = 0;
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  local_78.lightmode = opt->lightmode;
  local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
  local_78.num_threads = opt->num_threads;
  local_78.blob_allocator = opt->blob_allocator;
  local_78.workspace_allocator = opt->workspace_allocator;
  local_78.openmp_blocktime = opt->openmp_blocktime;
  local_78.use_winograd_convolution = opt->use_winograd_convolution;
  local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
  local_78.use_int8_inference = opt->use_int8_inference;
  local_78.use_vulkan_compute = opt->use_vulkan_compute;
  uVar29._0_1_ = opt->use_bf16_storage;
  uVar29._1_1_ = opt->use_fp16_packed;
  uVar29._2_1_ = opt->use_fp16_storage;
  uVar29._3_1_ = opt->use_fp16_arithmetic;
  uVar29._4_1_ = opt->use_int8_packed;
  uVar29._5_1_ = opt->use_int8_storage;
  uVar29._6_1_ = opt->use_int8_arithmetic;
  uVar29._7_1_ = opt->use_packing_layout;
  local_78.use_shader_pack8 = opt->use_shader_pack8;
  local_78.use_subgroup_basic = opt->use_subgroup_basic;
  local_78.use_subgroup_vote = opt->use_subgroup_vote;
  local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
  local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  local_78.use_image_storage = opt->use_image_storage;
  local_78.use_tensor_storage = opt->use_tensor_storage;
  local_78.use_reserved_0 = opt->use_reserved_0;
  local_78.flush_denormals = opt->flush_denormals;
  local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
  local_78.use_shader_local_memory = opt->use_shader_local_memory;
  local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
  local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
  local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
  local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
  local_78.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
  local_78.use_reserved_7 = opt->use_reserved_7;
  local_78.use_reserved_8 = opt->use_reserved_8;
  local_78.use_reserved_9 = opt->use_reserved_9;
  local_78.use_reserved_10 = opt->use_reserved_10;
  local_78.use_reserved_11 = opt->use_reserved_11;
  local_78._32_8_ = uVar29 & 0xffffffffffffff;
  local_1b8 = opt;
  local_198 = this;
  make_padding(this,bottom_blob,&local_118,&local_78);
  iVar11 = local_118.h;
  iVar10 = local_118.w;
  pCVar8 = local_198;
  iVar26 = -100;
  if ((local_118.data != (void *)0x0) && ((long)local_118.c * local_118.cstep != 0)) {
    local_1c0 = (void *)CONCAT44(local_1c0._4_4_,iVar16);
    uVar29 = (long)(~((iVar30 + -1) * iVar14) + local_118.w) / (long)local_198->stride_w;
    uVar17 = (long)(~((iVar15 + -1) * iVar2) + local_118.h) / (long)local_198->stride_h;
    uVar23 = (long)(~((iVar19 + -1) * iVar22) + local_118.d) / (long)local_198->stride_d;
    uVar13 = local_198->kernel_w * local_198->kernel_h * local_198->kernel_d;
    __n = (size_type)(int)uVar13;
    local_180 = top_blob;
    std::vector<int,_std::allocator<int>_>::vector(&local_90,__n,&local_1d1);
    piVar12 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    pMVar9 = local_180;
    _w = (int)uVar29 + 1;
    _h = (int)uVar17 + 1;
    local_1c8 = (float *)(ulong)_h;
    if (0 < pCVar8->kernel_d) {
      iVar16 = pCVar8->dilation_w;
      iVar30 = pCVar8->dilation_h;
      iVar15 = pCVar8->kernel_w;
      iVar14 = pCVar8->kernel_h;
      iVar2 = pCVar8->dilation_d;
      iVar19 = 0;
      iVar26 = 0;
      iVar22 = 0;
      do {
        if (0 < pCVar8->kernel_h) {
          iVar24 = 0;
          do {
            if (0 < pCVar8->kernel_w) {
              lVar25 = 0;
              do {
                local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar19 + lVar25] = iVar26;
                iVar26 = iVar26 + pCVar8->dilation_w;
                lVar25 = lVar25 + 1;
              } while ((int)lVar25 < pCVar8->kernel_w);
              iVar19 = iVar19 + (int)lVar25;
            }
            iVar26 = iVar26 + (iVar30 * iVar10 - iVar16 * iVar15);
            iVar24 = iVar24 + 1;
          } while (iVar24 < pCVar8->kernel_h);
        }
        iVar26 = iVar26 + (iVar11 * iVar2 - iVar30 * iVar14) * iVar10;
        iVar22 = iVar22 + 1;
      } while (iVar22 < pCVar8->kernel_d);
    }
    local_1d0 = uVar23 & 0xffffffff;
    local_168 = uVar29 & 0xffffffff;
    Mat::create(local_180,_w,_h,(int)uVar23 + 1,pCVar8->num_output,_elemsize,
                local_1b8->blob_allocator);
    iVar26 = -100;
    if ((pMVar9->data != (void *)0x0) && ((long)pMVar9->c * pMVar9->cstep != 0)) {
      iVar16 = pCVar8->group;
      if (iVar16 == pCVar8->num_output && (int)local_1c0 == iVar16) {
        local_140 = (long)pCVar8->group;
        if (0 < local_140) {
          local_148 = pMVar9->data;
          local_150 = pMVar9->cstep * pMVar9->elemsize;
          pvVar20 = (pCVar8->weight_data).data;
          local_1a8 = local_118.data;
          local_1b0 = local_118.cstep *
                      CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
          local_130 = (long)local_118.w *
                      CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
          local_138 = (void *)(local_118.h * local_130);
          local_b8._0_8_ = (long)(int)_w;
          uVar23 = (ulong)_w;
          lVar25 = 0;
          uVar29 = local_1d0;
          local_178 = uVar17 & 0xffffffff;
          local_160 = uVar23;
          do {
            if (-1 < (int)uVar29) {
              local_1a0 = (void *)(local_1b0 * lVar25 + (long)local_1a8);
              pvVar21 = (void *)(local_150 * lVar25 + (long)local_148);
              uVar17 = 0;
              local_158 = lVar25;
              do {
                local_128 = uVar17;
                if (-1 < (int)local_178) {
                  iVar16 = local_198->bias_term;
                  iVar30 = local_198->activation_type;
                  local_190 = (void *)((long)(int)uVar17 * (long)local_198->stride_d *
                                       (long)local_138 + (long)local_1a0);
                  local_180 = (Mat *)(long)local_198->stride_w;
                  local_170 = local_198->stride_h * local_130;
                  local_188 = (float *)0x0;
                  local_1c0 = (void *)CONCAT44(local_1c0._4_4_,iVar16);
                  do {
                    if (-1 < (int)local_168) {
                      pfVar3 = (float *)(local_198->activation_params).data;
                      pvVar4 = (local_198->bias_data).data;
                      local_1b8 = (Option *)((long)local_188 * local_170 + (long)local_190);
                      uVar29 = 0;
                      do {
                        if (iVar16 == 0) {
                          auVar34 = ZEXT812(0);
                        }
                        else {
                          auVar34._4_8_ = 0;
                          auVar34._0_4_ = *(uint *)((long)pvVar4 + lVar25 * 4);
                        }
                        auVar36._12_4_ = 0;
                        auVar36._0_12_ = auVar34;
                        if (0 < (int)uVar13) {
                          uVar17 = 0;
                          do {
                            auVar36._0_4_ =
                                 auVar36._0_4_ +
                                 *(float *)((long)pvVar20 + uVar17 * 4) *
                                 *(float *)(&local_1b8->lightmode +
                                           (long)piVar12[uVar17] * 4 + uVar29 * (long)local_180 * 4)
                            ;
                            uVar17 = uVar17 + 1;
                          } while (uVar13 != uVar17);
                        }
                        fVar31 = auVar36._0_4_;
                        switch(iVar30) {
                        case 1:
                          if (fVar31 <= 0.0) {
                            auVar5._12_4_ = 0;
                            auVar5._0_12_ = auVar36._4_12_;
                            auVar36 = auVar5 << 0x20;
                          }
                        default:
switchD_00546b6f_default:
                          fVar32 = auVar36._0_4_;
                          break;
                        case 2:
                          fVar32 = (float)(~-(uint)(0.0 < fVar31) & (uint)*pfVar3 |
                                          -(uint)(0.0 < fVar31) & 0x3f800000) * fVar31;
                          break;
                        case 3:
                          if (fVar31 <= *pfVar3) {
                            auVar36._0_4_ = *pfVar3;
                          }
                          fVar32 = pfVar3[1];
                          if (auVar36._0_4_ <= fVar32) {
                            fVar32 = auVar36._0_4_;
                          }
                          break;
                        case 4:
                          if (88.37626 <= fVar31) {
                            fVar31 = 88.37626;
                          }
                          fVar31 = expf((float)(-(uint)(fVar31 < -88.37626) & 0x42b0c0a5 |
                                               ~-(uint)(fVar31 < -88.37626) & (uint)-fVar31));
                          uVar23 = local_160;
                          lVar25 = local_158;
                          iVar16 = (int)local_1c0;
                          fVar32 = 1.0 / (fVar31 + 1.0);
                          break;
                        case 5:
                          local_c8 = auVar36;
                          fVar31 = expf(fVar31);
                          fVar31 = logf(fVar31 + 1.0);
                          fVar31 = tanhf(fVar31);
                          uVar23 = local_160;
                          lVar25 = local_158;
                          iVar16 = (int)local_1c0;
                          fVar32 = fVar31 * (float)local_c8._0_4_;
                          break;
                        case 6:
                          fVar1 = *pfVar3;
                          fVar33 = -pfVar3[1] / fVar1;
                          fVar32 = 0.0;
                          if (fVar33 <= fVar31) {
                            if (fVar33 + 1.0 / fVar1 < fVar31) goto switchD_00546b6f_default;
                            fVar32 = (fVar1 * fVar31 + pfVar3[1]) * fVar31;
                          }
                        }
                        *(float *)((long)pvVar21 + uVar29 * 4) = fVar32;
                        uVar29 = uVar29 + 1;
                      } while (uVar29 != uVar23);
                    }
                    pvVar21 = (void *)((long)pvVar21 + local_b8._0_8_ * 4);
                    local_188 = (float *)((long)local_188 + 1);
                  } while (local_188 != local_1c8);
                }
                uVar17 = (ulong)((int)local_128 + 1);
                uVar29 = local_1d0;
              } while ((int)local_128 != (int)local_1d0);
            }
            lVar25 = lVar25 + 1;
            pvVar20 = (void *)((long)pvVar20 + __n * 4);
          } while (lVar25 != local_140);
        }
      }
      else {
        uVar29 = (long)(int)local_1c0 / (long)iVar16;
        uVar27 = uVar29 & 0xffffffff;
        uVar17 = (long)pCVar8->num_output / (long)iVar16;
        uVar23 = uVar17 & 0xffffffff;
        local_98 = (long)pCVar8->group;
        if (0 < local_98) {
          local_148 = pMVar9->data;
          local_150 = pMVar9->cstep * pMVar9->elemsize;
          local_a0 = (pCVar8->weight_data).data;
          iVar16 = (int)uVar29 * uVar13;
          local_1b8 = (Option *)(ulong)(uint)pMVar9->w;
          local_170 = CONCAT44(local_170._4_4_,pMVar9->h);
          local_178 = CONCAT44(local_178._4_4_,pMVar9->d);
          local_128 = (ulong)pMVar9->w;
          local_11c = (uint)uVar17;
          local_a8 = (long)(int)local_11c;
          local_138 = (void *)(uVar17 & 0xffffffff);
          local_120 = iVar16 * local_11c;
          local_130 = (long)iVar16 << 2;
          local_1a8 = (void *)0x0;
          local_1b0 = 0;
          local_168 = CONCAT44(local_168._4_4_,(int)uVar29);
          do {
            if (0 < (int)uVar23) {
              local_c8._0_8_ = (void *)((long)local_a0 + (long)(int)local_1a8 * 4);
              local_140 = local_1b0 * local_a8;
              iVar30 = (int)uVar27;
              iVar16 = (int)local_1b0;
              local_1a0 = (void *)0x0;
              do {
                if (0 < (int)local_178) {
                  local_188 = (float *)((long)local_1a0 + local_140);
                  local_1e0 = (void *)(local_150 * (long)local_188 + (long)local_148);
                  local_1d0 = local_1d0 & 0xffffffff00000000;
                  do {
                    if (0 < (int)local_170) {
                      local_180 = (Mat *)CONCAT44(local_180._4_4_,local_198->bias_term);
                      iVar15 = local_198->activation_type;
                      local_190 = (void *)((ulong)local_190 & 0xffffffff00000000);
                      do {
                        if (0 < (int)local_1b8) {
                          local_1c8 = (float *)(local_198->activation_params).data;
                          local_1c0 = (local_198->bias_data).data;
                          lVar25 = (long)local_118.w *
                                   CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize)
                          ;
                          lVar28 = local_118.cstep *
                                   CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize)
                          ;
                          local_158 = (long)local_118.data +
                                      (long)(int)local_190 * (long)local_198->stride_h * lVar25 +
                                      local_118.h * lVar25 *
                                      (long)(int)local_1d0 * (long)local_198->stride_d;
                          local_160 = (ulong)local_198->stride_w;
                          lVar25 = 0;
                          do {
                            if ((int)local_180 == 0) {
                              auVar35 = ZEXT812(0);
                            }
                            else {
                              auVar35._4_8_ = 0;
                              auVar35._0_4_ = *(uint *)((long)local_1c0 + (long)local_188 * 4);
                            }
                            auVar37._12_4_ = 0;
                            auVar37._0_12_ = auVar35;
                            if (0 < (int)uVar27) {
                              uVar17 = 0;
                              lVar18 = local_c8._0_8_;
                              do {
                                if (0 < (int)uVar13) {
                                  uVar23 = 0;
                                  do {
                                    auVar37._0_4_ =
                                         auVar37._0_4_ +
                                         *(float *)(lVar18 + uVar23 * 4) *
                                         *(float *)(local_158 +
                                                   (long)piVar12[uVar23] * 4 +
                                                   (uVar17 + (uint)(iVar30 * iVar16)) * lVar28 +
                                                   lVar25 * local_160 * 4);
                                    uVar23 = uVar23 + 1;
                                  } while (uVar13 != uVar23);
                                }
                                uVar17 = uVar17 + 1;
                                lVar18 = lVar18 + __n * 4;
                              } while (uVar17 != (uVar29 & 0xffffffff));
                            }
                            fVar31 = auVar37._0_4_;
                            switch(iVar15) {
                            case 1:
                              if (fVar31 <= 0.0) {
                                auVar6._12_4_ = 0;
                                auVar6._0_12_ = auVar37._4_12_;
                                auVar37 = auVar6 << 0x20;
                              }
                            default:
switchD_00547028_default:
                              fVar32 = auVar37._0_4_;
                              break;
                            case 2:
                              fVar32 = (float)(~-(uint)(0.0 < fVar31) & (uint)*local_1c8 |
                                              -(uint)(0.0 < fVar31) & 0x3f800000) * fVar31;
                              break;
                            case 3:
                              if (fVar31 <= *local_1c8) {
                                auVar37._0_4_ = *local_1c8;
                              }
                              fVar32 = local_1c8[1];
                              if (auVar37._0_4_ <= fVar32) {
                                fVar32 = auVar37._0_4_;
                              }
                              break;
                            case 4:
                              if (88.37626 <= fVar31) {
                                fVar31 = 88.37626;
                              }
                              fVar31 = expf((float)(-(uint)(fVar31 < -88.37626) & 0x42b0c0a5 |
                                                   ~-(uint)(fVar31 < -88.37626) & (uint)-fVar31));
                              uVar27 = local_168 & 0xffffffff;
                              fVar32 = 1.0 / (fVar31 + 1.0);
                              break;
                            case 5:
                              local_b8 = auVar37;
                              fVar31 = expf(fVar31);
                              fVar31 = logf(fVar31 + 1.0);
                              fVar31 = tanhf(fVar31);
                              uVar27 = local_168 & 0xffffffff;
                              fVar32 = fVar31 * (float)local_b8._0_4_;
                              break;
                            case 6:
                              fVar1 = *local_1c8;
                              fVar33 = -local_1c8[1] / fVar1;
                              fVar32 = 0.0;
                              if (fVar33 <= fVar31) {
                                if (fVar33 + 1.0 / fVar1 < fVar31) goto switchD_00547028_default;
                                fVar32 = (fVar1 * fVar31 + local_1c8[1]) * fVar31;
                              }
                            }
                            *(float *)((long)local_1e0 + lVar25 * 4) = fVar32;
                            lVar25 = lVar25 + 1;
                          } while ((Option *)lVar25 != local_1b8);
                        }
                        local_1e0 = (void *)((long)local_1e0 + local_128 * 4);
                        iVar14 = (int)local_190 + 1;
                        local_190 = (void *)CONCAT44(local_190._4_4_,iVar14);
                      } while (iVar14 != (int)local_170);
                    }
                    iVar15 = (int)local_1d0 + 1;
                    local_1d0 = CONCAT44(local_1d0._4_4_,iVar15);
                  } while (iVar15 != (int)local_178);
                }
                local_1a0 = (void *)((long)local_1a0 + 1);
                local_c8._0_8_ = local_c8._0_8_ + local_130;
              } while (local_1a0 != local_138);
            }
            local_1b0 = local_1b0 + 1;
            local_1a8 = (void *)(ulong)(uint)((int)local_1a8 + local_120);
            uVar23 = (ulong)local_11c;
          } while (local_1b0 != local_98);
        }
      }
      iVar26 = 0;
    }
    if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  piVar7 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

int ConvolutionDepthWise3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extend_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extend_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extend_d = dilation_d * (kernel_d - 1) + 1;

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_extend_w) / stride_w + 1;
    int outh = (h - kernel_extend_h) / stride_h + 1;
    int outd = (d - kernel_extend_d) / stride_d + 1;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w * dilation_h - kernel_w * dilation_w;
        int gap1 = h * w * dilation_d - w * kernel_h * dilation_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += dilation_w;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    top_blob.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[g];

                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            float w = kptr[k];
                            sum += val * w;
                        }

                        outptr[j] = activation_ss(sum, activation_type, activation_params);
                    }

                    outptr += outw;
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                float* outptr = top_blob.channel(g * num_output_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

                // shadowed variable for less openmp task args
                const int outw = top_blob.w;
                const int outh = top_blob.h;
                const int outd = top_blob.d;

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            float sum = 0.f;

                            if (bias_term)
                                sum = bias_data[num_output_g * g + p];

                            const float* kptr = weight_data_ptr + maxk * channels_g * p;

                            for (int q = 0; q < channels_g; q++)
                            {
                                const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                                const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                                for (int l = 0; l < maxk; l++)
                                {
                                    float val = sptr[space_ofs[l]];

                                    float wt = kptr[l];
                                    sum += val * wt;
                                }

                                kptr += maxk;
                            }

                            outptr[j] = activation_ss(sum, activation_type, activation_params);
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}